

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

int Aig_ManCoCleanupBiere(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  
  iVar1 = p->nObjs[3];
  iVar2 = p->vCos->nSize;
  p->nObjs[3] = iVar2;
  if (p->nRegs != 0) {
    p->nTruePos = iVar2 - p->nRegs;
  }
  return iVar1 - iVar2;
}

Assistant:

static inline int          Aig_ManCoNum( Aig_Man_t * p )          { return p->nObjs[AIG_OBJ_CO];                     }